

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O1

int dwarfstring_reset(dwarfstring_s *g)

{
  if (g->s_size != 0) {
    g->s_avail = g->s_size;
    *g->s_data = '\0';
  }
  return 1;
}

Assistant:

int
dwarfstring_reset(struct dwarfstring_s *g)
{
    if (!g->s_size) {
        /* In initial condition, nothing to do. */
        return TRUE;
    }
    g->s_avail   = g->s_size;
    g->s_data[0] = 0;
    return TRUE;
}